

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCall.cpp
# Opt level: O1

MockExpectedCall * __thiscall
MockCheckedExpectedCall::withBoolParameter
          (MockCheckedExpectedCall *this,SimpleString *name,bool value)

{
  MockNamedValue *this_00;
  
  this_00 = (MockNamedValue *)
            operator_new(0x58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockExpectedCall.cpp"
                         ,0x5a);
  MockNamedValue::MockNamedValue(this_00,name);
  this_00->_vptr_MockNamedValue = (_func_int **)&PTR__MockNamedValue_00166ad0;
  *(undefined1 *)&this_00[1]._vptr_MockNamedValue = 0;
  MockNamedValueList::add(this->inputParameters_,this_00);
  (*this_00->_vptr_MockNamedValue[2])(this_00,(ulong)value);
  return &this->super_MockExpectedCall;
}

Assistant:

MockExpectedCall& MockCheckedExpectedCall::withBoolParameter(const SimpleString& name, bool value)
{
    MockNamedValue* newParameter = new MockExpectedFunctionParameter(name);
    inputParameters_->add(newParameter);
    newParameter->setValue(value);
    return *this;
}